

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O1

bool __thiscall
chaiscript::Type_Conversions::converts(Type_Conversions *this,Type_Info *to,Type_Info *from)

{
  bool bVar1;
  _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  *this_00;
  const_iterator cVar2;
  _Rb_tree_header *p_Var3;
  type_info *local_38;
  type_info *local_30;
  
  this_00 = &thread_cache(this)->_M_t;
  local_30 = to->m_bare_type_info;
  cVar2 = std::
          _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
          ::find(this_00,&local_30);
  p_Var3 = &(this_00->_M_impl).super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node != p_Var3) {
    local_38 = from->m_bare_type_info;
    cVar2 = std::
            _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
            ::find(this_00,&local_38);
    if ((_Rb_tree_header *)cVar2._M_node != p_Var3) {
      bVar1 = has_conversion(this,to,from);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool converts(const Type_Info &to, const Type_Info &from) const noexcept {
      const auto &types = thread_cache();
      if (types.count(to.bare_type_info()) != 0 && types.count(from.bare_type_info()) != 0) {
        return has_conversion(to, from);
      } else {
        return false;
      }
    }